

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_encode_memory
               (uchar **out,size_t *outsize,uchar *image,uint w,uint h,LodePNGColorType colortype,
               uint bitdepth)

{
  LodePNGState state;
  uint error;
  LodePNGState *in_stack_000003f0;
  uint in_stack_000003f8;
  uint in_stack_000003fc;
  uchar *in_stack_00000400;
  size_t *in_stack_00000408;
  uchar **in_stack_00000410;
  undefined4 local_30;
  
  lodepng_state_init((LodePNGState *)0x65f525);
  lodepng_encode(in_stack_00000410,in_stack_00000408,in_stack_00000400,in_stack_000003fc,
                 in_stack_000003f8,in_stack_000003f0);
  lodepng_state_cleanup((LodePNGState *)0x65f5a2);
  return local_30;
}

Assistant:

unsigned lodepng_encode_memory(unsigned char** out, size_t* outsize, const unsigned char* image,
                               unsigned w, unsigned h, LodePNGColorType colortype, unsigned bitdepth) {
  unsigned error;
  LodePNGState state;
  lodepng_state_init(&state);
  state.info_raw.colortype = colortype;
  state.info_raw.bitdepth = bitdepth;
  state.info_png.color.colortype = colortype;
  state.info_png.color.bitdepth = bitdepth;
  lodepng_encode(out, outsize, image, w, h, &state);
  error = state.error;
  lodepng_state_cleanup(&state);
  return error;
}